

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_GenerateResampled(ym3438_t *chip,Bit16s *buf)

{
  short local_1c;
  short local_1a;
  Bit16s *pBStack_18;
  Bit16s buffer [2];
  Bit16s *buf_local;
  ym3438_t *chip_local;
  
  pBStack_18 = buf;
  while (chip->rateratio <= chip->samplecnt) {
    chip->oldsamples[0] = chip->samples[0];
    chip->oldsamples[1] = chip->samples[1];
    OPN2_Generate(chip,&local_1c);
    chip->samples[0] = local_1c * 0xb;
    chip->samples[1] = local_1a * 0xb;
    chip->samplecnt = chip->samplecnt - chip->rateratio;
  }
  *pBStack_18 = (Bit16s)((chip->oldsamples[0] * (chip->rateratio - chip->samplecnt) +
                         chip->samples[0] * chip->samplecnt) / chip->rateratio >> 1);
  pBStack_18[1] =
       (Bit16s)((chip->oldsamples[1] * (chip->rateratio - chip->samplecnt) +
                chip->samples[1] * chip->samplecnt) / chip->rateratio >> 1);
  chip->samplecnt = chip->samplecnt + 0x400;
  return;
}

Assistant:

void OPN2_GenerateResampled(ym3438_t *chip, Bit16s *buf)
{
    Bit16s buffer[2];

    while (chip->samplecnt >= chip->rateratio)
    {
        chip->oldsamples[0] = chip->samples[0];
        chip->oldsamples[1] = chip->samples[1];
        OPN2_Generate(chip, buffer);
        chip->samples[0] = buffer[0] * 11;
        chip->samples[1] = buffer[1] * 11;
        chip->samplecnt -= chip->rateratio;
    }
    buf[0] = (Bit16s)(((chip->oldsamples[0] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[0] * chip->samplecnt) / chip->rateratio)>>1);
    buf[1] = (Bit16s)(((chip->oldsamples[1] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[1] * chip->samplecnt) / chip->rateratio)>>1);
    chip->samplecnt += 1 << RSM_FRAC;
}